

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

MontgomeryCurve * ecc_montgomery_curve(mp_int *p,mp_int *a,mp_int *b)

{
  MontgomeryCurve *pMVar1;
  mp_int *pmVar2;
  MontyContext *mc;
  mp_int *y;
  mp_int *r;
  mp_int *x;
  mp_int *pmVar3;
  
  pMVar1 = (MontgomeryCurve *)safemalloc(1,0x28,0);
  pmVar2 = mp_copy(p);
  pMVar1->p = pmVar2;
  mc = monty_new(p);
  pMVar1->mc = mc;
  pmVar2 = monty_import(mc,a);
  pMVar1->a = pmVar2;
  pmVar2 = monty_import(pMVar1->mc,b);
  pMVar1->b = pmVar2;
  pmVar2 = mp_from_integer(4);
  y = mp_invert(pmVar2,pMVar1->p);
  r = mp_copy(a);
  mp_add_integer_into(r,r,2);
  x = mp_modmul(r,y,pMVar1->p);
  pmVar3 = monty_import(pMVar1->mc,x);
  pMVar1->aplus2over4 = pmVar3;
  mp_free(pmVar2);
  mp_free(y);
  mp_free(r);
  mp_free(x);
  return pMVar1;
}

Assistant:

MontgomeryCurve *ecc_montgomery_curve(
    mp_int *p, mp_int *a, mp_int *b)
{
    MontgomeryCurve *mc = snew(MontgomeryCurve);
    mc->p = mp_copy(p);
    mc->mc = monty_new(p);
    mc->a = monty_import(mc->mc, a);
    mc->b = monty_import(mc->mc, b);

    mp_int *four = mp_from_integer(4);
    mp_int *fourinverse = mp_invert(four, mc->p);
    mp_int *aplus2 = mp_copy(a);
    mp_add_integer_into(aplus2, aplus2, 2);
    mp_int *aplus2over4 = mp_modmul(aplus2, fourinverse, mc->p);
    mc->aplus2over4 = monty_import(mc->mc, aplus2over4);
    mp_free(four);
    mp_free(fourinverse);
    mp_free(aplus2);
    mp_free(aplus2over4);

    return mc;
}